

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# guard_builder.cpp
# Opt level: O3

void __thiscall
r_exec::NoArgCmdGuardBuilder::_build
          (NoArgCmdGuardBuilder *this,Code *mdl,uint16_t q0,uint16_t t0,uint16_t t1,
          uint16_t *write_index)

{
  NoArgCmdGuardBuilder *pNVar1;
  undefined2 uVar2;
  uint16_t uVar3;
  uint16_t uVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined6 in_register_00000012;
  uint uVar7;
  TimingGuardBuilder *pTVar8;
  undefined6 in_register_00000082;
  uint uVar9;
  undefined1 local_54 [6];
  uint16_t extent_index;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint16_t local_40;
  uint16_t local_3e;
  uint local_3c;
  NoArgCmdGuardBuilder *local_38;
  long *plVar6;
  
  local_44 = (uint)CONCAT62(in_register_00000082,t1);
  local_38 = this;
  iVar5 = (*(mdl->super__Object)._vptr__Object[9])(mdl,1,CONCAT62(in_register_00000012,q0));
  plVar6 = (long *)CONCAT44(extraout_var,iVar5);
  (**(code **)(*plVar6 + 0x20))(plVar6,2);
  uVar2 = r_code::Atom::asIndex();
  local_4c = CONCAT22(local_4c._2_2_,uVar2);
  (**(code **)(*plVar6 + 0x20))(plVar6,3);
  uVar2 = r_code::Atom::asIndex();
  local_48 = CONCAT22(local_48._2_2_,uVar2);
  iVar5 = (*(mdl->super__Object)._vptr__Object[9])(mdl,0);
  plVar6 = (long *)CONCAT44(extraout_var_00,iVar5);
  (**(code **)(*plVar6 + 0x20))(plVar6,2);
  uVar3 = r_code::Atom::asIndex();
  (**(code **)(*plVar6 + 0x20))(plVar6,3);
  uVar4 = r_code::Atom::asIndex();
  *write_index = *write_index + 1;
  r_code::Atom::IPointer((ushort)local_54);
  iVar5 = (*(mdl->super__Object)._vptr__Object[4])(mdl,3);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_01,iVar5),(Atom *)local_54);
  local_40 = uVar3;
  local_3e = uVar4;
  r_code::Atom::~Atom((Atom *)local_54);
  r_code::Atom::Set((uchar)local_54);
  iVar5 = (*(mdl->super__Object)._vptr__Object[4])(mdl,(ulong)*write_index);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_02,iVar5),(Atom *)local_54);
  pTVar8 = (TimingGuardBuilder *)local_54;
  r_code::Atom::~Atom((Atom *)pTVar8);
  pNVar1 = local_38;
  extent_index = *write_index + 2;
  uVar3 = (uint16_t)local_4c;
  local_3c = local_4c & 0xffff;
  local_4c = (uint)t0;
  TimingGuardBuilder::write_guard
            (pTVar8,mdl,uVar3,t0,Opcodes::Add,(local_38->super_TimingGuardBuilder).period,
             write_index,&extent_index);
  uVar9 = local_48 & 0xffff;
  uVar7 = local_44 & 0xffff;
  TimingGuardBuilder::write_guard
            (pTVar8,mdl,(uint16_t)local_48,(uint16_t)local_44,Opcodes::Add,
             (pNVar1->super_TimingGuardBuilder).period,write_index,&extent_index);
  *write_index = extent_index + 1;
  r_code::Atom::IPointer((ushort)local_54);
  iVar5 = (*(mdl->super__Object)._vptr__Object[4])(mdl,4);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_03,iVar5),(Atom *)local_54);
  local_48 = uVar7;
  local_44 = uVar9;
  r_code::Atom::~Atom((Atom *)local_54);
  r_code::Atom::Set((uchar)local_54);
  iVar5 = (*(mdl->super__Object)._vptr__Object[4])(mdl,(ulong)*write_index);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_04,iVar5),(Atom *)local_54);
  pTVar8 = (TimingGuardBuilder *)local_54;
  r_code::Atom::~Atom((Atom *)pTVar8);
  pNVar1 = local_38;
  extent_index = *write_index + 4;
  uVar4 = (uint16_t)local_3c;
  TimingGuardBuilder::write_guard
            (pTVar8,mdl,(uint16_t)local_4c,uVar4,Opcodes::Sub,
             (local_38->super_TimingGuardBuilder).period,write_index,&extent_index);
  TimingGuardBuilder::write_guard
            (pTVar8,mdl,(uint16_t)local_48,(uint16_t)local_44,Opcodes::Sub,
             (pNVar1->super_TimingGuardBuilder).period,write_index,&extent_index);
  uVar3 = local_40;
  TimingGuardBuilder::write_guard
            (pTVar8,mdl,local_40,uVar4,Opcodes::Sub,pNVar1->offset,write_index,&extent_index);
  TimingGuardBuilder::write_guard
            (pTVar8,mdl,local_3e,uVar3,Opcodes::Add,pNVar1->cmd_duration,write_index,&extent_index);
  *write_index = extent_index;
  return;
}

Assistant:

void NoArgCmdGuardBuilder::_build(Code *mdl, uint16_t q0, uint16_t t0, uint16_t t1, uint16_t &write_index) const
{
    Code *rhs = mdl->get_reference(1);
    uint16_t t2 = rhs->code(FACT_AFTER).asIndex();
    uint16_t t3 = rhs->code(FACT_BEFORE).asIndex();
    Code *lhs = mdl->get_reference(0);
    uint16_t cmd_t0 = lhs->code(FACT_AFTER).asIndex();
    uint16_t cmd_t1 = lhs->code(FACT_BEFORE).asIndex();
    mdl->code(MDL_FWD_GUARDS) = Atom::IPointer(++write_index);
    mdl->code(write_index) = Atom::Set(2);
    uint16_t extent_index = write_index + 2;
    write_guard(mdl, t2, t0, Opcodes::Add, period, write_index, extent_index);
    write_guard(mdl, t3, t1, Opcodes::Add, period, write_index, extent_index);
    write_index = extent_index;
    mdl->code(MDL_BWD_GUARDS) = Atom::IPointer(++write_index);
    mdl->code(write_index) = Atom::Set(4);
    extent_index = write_index + 4;
    write_guard(mdl, t0, t2, Opcodes::Sub, period, write_index, extent_index);
    write_guard(mdl, t1, t3, Opcodes::Sub, period, write_index, extent_index);
    write_guard(mdl, cmd_t0, t2, Opcodes::Sub, offset, write_index, extent_index);
    write_guard(mdl, cmd_t1, cmd_t0, Opcodes::Add, cmd_duration, write_index, extent_index);
    write_index = extent_index;
}